

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void preserveExpr(IdxExprTrans *pTrans,Expr *pExpr)

{
  WhereExprMod *pWVar1;
  WhereExprMod *pNew;
  Expr *pExpr_local;
  IdxExprTrans *pTrans_local;
  
  pWVar1 = (WhereExprMod *)sqlite3DbMallocRaw(pTrans->db,0x58);
  if (pWVar1 != (WhereExprMod *)0x0) {
    pWVar1->pNext = pTrans->pWInfo->pExprMods;
    pTrans->pWInfo->pExprMods = pWVar1;
    pWVar1->pExpr = pExpr;
    memcpy(&pWVar1->orig,pExpr,0x48);
  }
  return;
}

Assistant:

static void preserveExpr(IdxExprTrans *pTrans, Expr *pExpr){
  WhereExprMod *pNew;
  pNew = sqlite3DbMallocRaw(pTrans->db, sizeof(*pNew));
  if( pNew==0 ) return;
  pNew->pNext = pTrans->pWInfo->pExprMods;
  pTrans->pWInfo->pExprMods = pNew;
  pNew->pExpr = pExpr;
  memcpy(&pNew->orig, pExpr, sizeof(*pExpr));
}